

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
copy_or_move_from<google::dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
          (dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *ht,size_type min_buckets_wanted)

{
  int iVar1;
  long lVar2;
  int *value;
  size_type new_num_buckets;
  ulong uVar3;
  int iVar4;
  long lVar5;
  iterator __begin0;
  iterator __end0;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_50;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_38;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
                 ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
                  ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear_to_size((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)this,new_num_buckets);
  local_50.pos = ht->table;
  local_50.end = local_50.pos + ht->num_buckets;
  local_50.ht = ht;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_50);
  local_38.pos = ht->table + ht->num_buckets;
  local_38.ht = ht;
  local_38.end = local_38.pos;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_38);
  if (local_50.pos != local_38.pos) {
    do {
      iVar1 = *local_50.pos;
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
      lVar2 = *(long *)(this + 0x70);
      iVar4 = *(int *)(this + 0x38);
      uVar3 = -(long)iVar1 & *(long *)(this + 0x58) - 1U;
      iVar1 = *(int *)(lVar2 + uVar3 * 4);
      *(int *)(this + 0x38) = iVar4 + 1;
      if (iVar1 + *(int *)(this + 0x40) != 0) {
        iVar4 = iVar4 + 2;
        lVar5 = 1;
        do {
          uVar3 = uVar3 + lVar5 & *(long *)(this + 0x58) - 1U;
          iVar1 = *(int *)(lVar2 + uVar3 * 4);
          *(int *)(this + 0x38) = iVar4;
          iVar4 = iVar4 + 1;
          lVar5 = lVar5 + 1;
        } while (iVar1 + *(int *)(this + 0x40) != 0);
      }
      *(int *)(lVar2 + uVar3 * 4) = *local_50.pos;
      *(long *)(this + 0x50) = *(long *)(this + 0x50) + 1;
      local_50.pos = local_50.pos + 1;
      dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_empty_and_deleted(&local_50);
    } while (local_50.pos != local_38.pos);
  }
  *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }